

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int poolGrow(STRING_POOL *pool)

{
  block *pbVar1;
  int iVar2;
  BLOCK *pBVar3;
  int local_34;
  int blockSize_1;
  BLOCK *tem_1;
  int blockSize;
  BLOCK *tem;
  STRING_POOL *pool_local;
  
  if (pool->freeBlocks != (BLOCK *)0x0) {
    if (pool->start == (XML_Char *)0x0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = (block *)0x0;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return 1;
    }
    if ((long)pool->end - (long)pool->start < (long)pool->freeBlocks->size) {
      pbVar1 = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pbVar1;
      memcpy(pool->blocks->s,pool->start,(long)pool->end - (long)pool->start);
      pool->ptr = pool->ptr + (long)pool->blocks + (0xc - (long)pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return 1;
    }
  }
  if ((pool->blocks == (BLOCK *)0x0) || (pool->start != pool->blocks->s)) {
    local_34 = (int)pool->end - (int)pool->start;
    if (local_34 < 0x400) {
      local_34 = 0x400;
    }
    else {
      local_34 = local_34 * 2;
    }
    pBVar3 = (BLOCK *)(*pool->mem->malloc_fcn)((long)local_34 + 0xc);
    if (pBVar3 == (BLOCK *)0x0) {
      return 0;
    }
    pBVar3->size = local_34;
    pBVar3->next = pool->blocks;
    pool->blocks = pBVar3;
    if (pool->ptr != pool->start) {
      memcpy(pBVar3->s,pool->start,(long)pool->ptr - (long)pool->start);
    }
    pool->ptr = pool->ptr + (0xc - (long)pool->start) + (long)(pBVar3->s + -0xc);
    pool->start = pBVar3->s;
    pool->end = pBVar3->s + local_34;
  }
  else {
    iVar2 = ((int)pool->end - (int)pool->start) * 2;
    pBVar3 = (BLOCK *)(*pool->mem->realloc_fcn)(pool->blocks,(long)iVar2 + 0xc);
    pool->blocks = pBVar3;
    if (pool->blocks == (BLOCK *)0x0) {
      return 0;
    }
    pool->blocks->size = iVar2;
    pool->ptr = pool->ptr + (long)pool->blocks + (0xc - (long)pool->start);
    pool->start = pool->blocks->s;
    pool->end = pool->start + iVar2;
  }
  return 1;
}

Assistant:

static
int poolGrow(STRING_POOL *pool)
{
  if (pool->freeBlocks) {
    if (pool->start == 0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = 0;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return 1;
    }
    if (pool->end - pool->start < pool->freeBlocks->size) {
      BLOCK *tem = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = tem;
      memcpy(pool->blocks->s, pool->start, (pool->end - pool->start) * sizeof(XML_Char));
      pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return 1;
    }
  }
  if (pool->blocks && pool->start == pool->blocks->s) {
    int blockSize = (pool->end - pool->start)*2;
    pool->blocks = pool->mem->realloc_fcn(pool->blocks, offsetof(BLOCK, s) + blockSize * sizeof(XML_Char));
    if (!pool->blocks)
      return 0;
    pool->blocks->size = blockSize;
    pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
    pool->start = pool->blocks->s;
    pool->end = pool->start + blockSize;
  }
  else {
    BLOCK *tem;
    int blockSize = pool->end - pool->start;
    if (blockSize < INIT_BLOCK_SIZE)
      blockSize = INIT_BLOCK_SIZE;
    else
      blockSize *= 2;
    tem = pool->mem->malloc_fcn(offsetof(BLOCK, s) + blockSize * sizeof(XML_Char));
    if (!tem)
      return 0;
    tem->size = blockSize;
    tem->next = pool->blocks;
    pool->blocks = tem;
    if (pool->ptr != pool->start)
      memcpy(tem->s, pool->start, (pool->ptr - pool->start) * sizeof(XML_Char));
    pool->ptr = tem->s + (pool->ptr - pool->start);
    pool->start = tem->s;
    pool->end = tem->s + blockSize;
  }
  return 1;
}